

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  element_type *peVar2;
  ostream *poVar3;
  int local_1dc;
  duration<long,_std::ratio<1L,_1000L>_> local_1d8;
  shared_ptr<media::EasyScreenCapturer> local_1d0;
  __cxx11 local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [8];
  string filename;
  int local_138;
  allocator local_131;
  int i;
  shared_ptr<media::EasyScreenCapturer> local_110;
  allocator local_f9;
  string local_f8 [32];
  shared_ptr<media::EasyScreenCapturer> local_d8;
  allocator local_c1;
  string local_c0 [32];
  shared_ptr<media::EasyScreenCapturer> local_a0;
  allocator local_89;
  string local_88 [32];
  shared_ptr<media::EasyScreenCapturer> local_68 [2];
  allocator local_41;
  string local_40 [32];
  shared_ptr<media::EasyScreenCapturer> local_20;
  undefined4 local_c;
  
  local_c = 0;
  media::EasyScreenCapturer::GetInstance();
  peVar2 = std::
           __shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"test0.bmp",&local_41);
  (**(code **)(*(long *)peVar2 + 0x18))(peVar2,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::shared_ptr<media::EasyScreenCapturer>::~shared_ptr(&local_20);
  media::EasyScreenCapturer::GetInstance();
  peVar2 = std::
           __shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"test1.bmp",&local_89);
  (**(code **)(*(long *)peVar2 + 0x18))(peVar2,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::shared_ptr<media::EasyScreenCapturer>::~shared_ptr(local_68);
  media::EasyScreenCapturer::GetInstance();
  peVar2 = std::
           __shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"test2.bmp",&local_c1);
  (**(code **)(*(long *)peVar2 + 0x18))(peVar2,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::shared_ptr<media::EasyScreenCapturer>::~shared_ptr(&local_a0);
  media::EasyScreenCapturer::GetInstance();
  peVar2 = std::
           __shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"test_1.bmp",&local_f9);
  iVar1 = (**(code **)(*(long *)peVar2 + 0x10))(peVar2,local_f8,0,0,0x556,0x300);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::shared_ptr<media::EasyScreenCapturer>::~shared_ptr(&local_d8);
  media::EasyScreenCapturer::GetInstance();
  peVar2 = std::
           __shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"test_2.bmp",&local_131);
  iVar1 = (**(code **)(*(long *)peVar2 + 0x10))(peVar2,&i,100,100,0x4f2,0x29c);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::shared_ptr<media::EasyScreenCapturer>::~shared_ptr(&local_110);
  local_138 = 0;
  while (local_138 < 1000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"img/test_",&local_199);
    std::__cxx11::to_string(local_1c0,local_138 + 1);
    std::operator+(local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    std::operator+(local_158,(char *)local_178);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    media::EasyScreenCapturer::GetInstance();
    peVar2 = std::
             __shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_1d0);
    (**(code **)(*(long *)peVar2 + 0x18))(peVar2,local_158);
    std::shared_ptr<media::EasyScreenCapturer>::~shared_ptr(&local_1d0);
    local_1dc = 0x32;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_1d8,&local_1dc);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_1d8);
    std::__cxx11::string::~string((string *)local_158);
    local_138 = local_138 + 1;
  }
  return 0;
}

Assistant:

int main() {
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test0.bmp");
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test1.bmp");
    media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp("test2.bmp");
    std::cout << media::EasyScreenCapturer::GetInstance()->CaptureScreenAsBmp("test_1.bmp", 0, 0, 1366, 768) << std::endl;
    std::cout << media::EasyScreenCapturer::GetInstance()->CaptureScreenAsBmp("test_2.bmp", 100, 100, 1266, 668) << std::endl;
    int i = 0;
    while (i++ < 1000) {
        std::string filename = std::string("img/test_") + std::to_string(i) + ".bmp";
        media::EasyScreenCapturer::GetInstance()->CaptureFullScreenAsBmp(filename);
        std::this_thread::sleep_for(std::chrono::milliseconds(50)); //20fps
    }

    return 0;
}